

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O2

void __thiscall
lzham::lzcompressor::node::add_state
          (node *this,int parent_index,int parent_state_index,lzdecision *lzdec,state *parent_state,
          bit_cost_t total_cost,uint total_complexity)

{
  uint *puVar1;
  node_state *pnVar2;
  state_base *psVar3;
  ulong uVar4;
  bit_cost_t bVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  node *pnVar13;
  uint *puVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  state_base local_80;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined7 uStack_40;
  undefined1 uStack_39;
  undefined7 uStack_38;
  undefined1 uStack_31;
  
  local_80.m_cur_ofs = (parent_state->super_state_base).m_cur_ofs;
  local_80.m_cur_state = (parent_state->super_state_base).m_cur_state;
  local_80.m_match_hist._0_8_ = *(undefined8 *)(parent_state->super_state_base).m_match_hist;
  local_80.m_match_hist._8_8_ = *(undefined8 *)((parent_state->super_state_base).m_match_hist + 2);
  state_base::partial_advance(&local_80,lzdec);
  uVar18 = this->m_num_node_states;
  while( true ) {
    uVar18 = uVar18 - 1;
    if ((int)uVar18 < 0) break;
    uVar17 = (ulong)uVar18;
    bVar9 = state_base::operator==(&this->m_node_states[uVar17].m_saved_state,&local_80);
    if (bVar9) {
      pnVar2 = this->m_node_states + uVar17;
      if (pnVar2->m_total_cost <= total_cost) {
        if (pnVar2->m_total_cost != total_cost) {
          return;
        }
        if (pnVar2->m_total_complexity <= total_complexity) {
          return;
        }
      }
      pnVar2->m_parent_index = (int16)parent_index;
      pnVar2->m_parent_state_index = (int8)parent_state_index;
      iVar7 = lzdec->m_len;
      (pnVar2->m_lzdec).m_pos = lzdec->m_pos;
      (pnVar2->m_lzdec).m_len = iVar7;
      (pnVar2->m_lzdec).m_dist = lzdec->m_dist;
      pnVar2->m_total_cost = total_cost;
      pnVar2->m_total_complexity = total_complexity;
      puVar14 = &this->m_node_states[uVar17 - 1].m_total_complexity;
      for (; uVar18 = (uint)uVar17, 0 < (int)uVar18; uVar17 = uVar17 - 1) {
        if ((*(ulong *)(puVar14 + -2) <= *(ulong *)(puVar14 + 0xc)) &&
           ((*(ulong *)(puVar14 + 0xc) != *(ulong *)(puVar14 + -2) || (*puVar14 <= puVar14[0xe]))))
        goto LAB_0010d5d8;
        puVar1 = puVar14 + 2;
        pnVar2 = (node_state *)(puVar14 + -0xc);
        uStack_38 = (undefined7)*(undefined8 *)(puVar14 + 0xe);
        uStack_31 = (undefined1)((ulong)*(undefined8 *)(puVar14 + 0xe) >> 0x38);
        local_68 = *(undefined8 *)puVar1;
        uStack_60 = *(undefined8 *)(puVar14 + 4);
        local_58 = *(undefined8 *)(puVar14 + 6);
        uStack_50 = *(undefined8 *)(puVar14 + 8);
        local_48 = *(undefined8 *)(puVar14 + 10);
        bVar5 = *(bit_cost_t *)(puVar14 + 0xc);
        uStack_40 = (undefined7)bVar5;
        uStack_39 = (undefined1)(bVar5 >> 0x38);
        *(undefined8 *)((long)puVar14 + 0x37) = *(undefined8 *)((long)puVar14 + -1);
        iVar7 = (pnVar2->m_lzdec).m_pos;
        iVar8 = (pnVar2->m_lzdec).m_len;
        uVar6 = *(undefined8 *)(puVar14 + -10);
        *(undefined8 *)(puVar14 + 10) = *(undefined8 *)(puVar14 + -4);
        *(bit_cost_t *)(puVar14 + 0xc) = *(bit_cost_t *)(puVar14 + -2);
        *(undefined8 *)(puVar14 + 6) = *(undefined8 *)(puVar14 + -8);
        *(undefined8 *)(puVar14 + 8) = *(undefined8 *)(puVar14 + -6);
        puVar1[0] = iVar7;
        puVar1[1] = iVar8;
        *(undefined8 *)(puVar14 + 4) = uVar6;
        *(undefined8 *)(puVar14 + -4) = local_48;
        *(bit_cost_t *)(puVar14 + -2) = bVar5;
        *(ulong *)((long)puVar14 + -1) = CONCAT71(uStack_38,uStack_39);
        *(undefined8 *)(puVar14 + -8) = local_58;
        *(undefined8 *)(puVar14 + -6) = uStack_50;
        (pnVar2->m_lzdec).m_pos = (int)local_68;
        (pnVar2->m_lzdec).m_len = (int)((ulong)local_68 >> 0x20);
        *(undefined8 *)(puVar14 + -10) = uStack_60;
        puVar14 = puVar14 + -0xe;
      }
      uVar18 = 0;
    }
LAB_0010d5d8:
    if (bVar9) {
      return;
    }
  }
  uVar11 = this->m_num_node_states;
  uVar17 = (ulong)uVar11;
  lVar15 = (uVar17 << 0x20) + 0x100000000;
  lVar12 = 0;
  pnVar13 = this;
  do {
    if ((int)(uVar11 + (uint)lVar12) < 1) {
LAB_0010d64d:
      uVar16 = (uVar11 < 4) - 1;
      uVar10 = uVar11;
      if (uVar16 != (uint)lVar12) {
        memmove(this->m_node_states + (lVar15 >> 0x20),pnVar13->m_node_states + (int)uVar11,
                ((ulong)uVar16 - lVar12 & 0xffffffff) * 0x38);
        uVar10 = this->m_num_node_states;
      }
      lVar12 = (int)uVar11 + lVar12;
      this->m_node_states[lVar12].m_parent_index = (int16)parent_index;
      this->m_node_states[lVar12].m_parent_state_index = (int8)parent_state_index;
      iVar7 = lzdec->m_len;
      this->m_node_states[lVar12].m_lzdec.m_pos = lzdec->m_pos;
      this->m_node_states[lVar12].m_lzdec.m_len = iVar7;
      this->m_node_states[lVar12].m_lzdec.m_dist = lzdec->m_dist;
      this->m_node_states[lVar12].m_total_cost = total_cost;
      this->m_node_states[lVar12].m_total_complexity = total_complexity;
      psVar3 = &this->m_node_states[lVar12].m_saved_state;
      psVar3->m_cur_ofs = local_80.m_cur_ofs;
      psVar3->m_cur_state = local_80.m_cur_state;
      *(undefined8 *)psVar3->m_match_hist = local_80.m_match_hist._0_8_;
      *(undefined8 *)(this->m_node_states[lVar12].m_saved_state.m_match_hist + 2) =
           local_80.m_match_hist._8_8_;
      uVar11 = 4;
      if (uVar10 + 1 < 4) {
        uVar11 = uVar10 + 1;
      }
      this->m_num_node_states = uVar11;
      return;
    }
    uVar4 = pnVar13->m_node_states[uVar17 - 1].m_total_cost;
    if ((uVar4 < total_cost) ||
       ((uVar4 == total_cost &&
        (pnVar13->m_node_states[uVar17 - 1].m_total_complexity <= total_complexity)))) {
      if (uVar17 + lVar12 == 4) {
        return;
      }
      goto LAB_0010d64d;
    }
    lVar15 = lVar15 + -0x100000000;
    lVar12 = lVar12 + -1;
    pnVar13 = (node *)(pnVar13[-1].m_node_states + 3);
  } while( true );
}

Assistant:

void lzcompressor::node::add_state(
      int parent_index, int parent_state_index,
      const lzdecision &lzdec, state &parent_state,
      bit_cost_t total_cost,
      uint total_complexity)
   {
      state_base trial_state;
      parent_state.save_partial_state(trial_state);
      trial_state.partial_advance(lzdec);

      for (int i = m_num_node_states - 1; i >= 0; i--)
      {
         node_state &cur_node_state = m_node_states[i];
         if (cur_node_state.m_saved_state == trial_state)
         {
            if ( (total_cost < cur_node_state.m_total_cost) ||
                 ((total_cost == cur_node_state.m_total_cost) && (total_complexity < cur_node_state.m_total_complexity)) )
            {
               cur_node_state.m_parent_index = static_cast<int16>(parent_index);
               cur_node_state.m_parent_state_index = static_cast<int8>(parent_state_index);
               cur_node_state.m_lzdec = lzdec;
               cur_node_state.m_total_cost = total_cost;
               cur_node_state.m_total_complexity = total_complexity;

               while (i > 0)
               {
                  if ((m_node_states[i].m_total_cost < m_node_states[i - 1].m_total_cost) ||
                      ((m_node_states[i].m_total_cost == m_node_states[i - 1].m_total_cost) && (m_node_states[i].m_total_complexity < m_node_states[i - 1].m_total_complexity)))
                  {
                     std::swap(m_node_states[i], m_node_states[i - 1]);
                     i--;
                  }
                  else
                     break;
               }
            }

            return;
         }
      }

      int insert_index;
      for (insert_index = m_num_node_states; insert_index > 0; insert_index--)
      {
         node_state &cur_node_state = m_node_states[insert_index - 1];

         if ( (total_cost > cur_node_state.m_total_cost) ||
              ((total_cost == cur_node_state.m_total_cost) && (total_complexity >= cur_node_state.m_total_complexity)) )
         {
            break;
         }
      }

      if (insert_index == cMaxNodeStates)
         return;

      uint num_behind = m_num_node_states - insert_index;
      uint num_to_move = (m_num_node_states < cMaxNodeStates) ? num_behind : (num_behind - 1);
      if (num_to_move)
      {
         LZHAM_ASSERT((insert_index + 1 + num_to_move) <= cMaxNodeStates);
         memmove( &m_node_states[insert_index + 1], &m_node_states[insert_index], sizeof(node_state) * num_to_move);
      }

      node_state *pNew_node_state = &m_node_states[insert_index];
      pNew_node_state->m_parent_index = static_cast<int16>(parent_index);
      pNew_node_state->m_parent_state_index = static_cast<uint8>(parent_state_index);
      pNew_node_state->m_lzdec = lzdec;
      pNew_node_state->m_total_cost = total_cost;
      pNew_node_state->m_total_complexity = total_complexity;
      pNew_node_state->m_saved_state = trial_state;

      m_num_node_states = LZHAM_MIN(m_num_node_states + 1, cMaxNodeStates);

#ifdef LZHAM_LZVERIFY
      for (uint i = 0; i < (m_num_node_states - 1); ++i)
      {
         node_state &a = m_node_states[i];
         node_state &b = m_node_states[i + 1];
         LZHAM_VERIFY(
            (a.m_total_cost < b.m_total_cost) ||
            ((a.m_total_cost == b.m_total_cost) && (a.m_total_complexity <= b.m_total_complexity)) );
      }
#endif
   }